

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O2

UBool icu_63::enumNames(UCharNames *names,UChar32 start,UChar32 limit,UEnumCharNamesFn *fn,
                       void *context,UCharNameChoice nameChoice)

{
  ushort uVar1;
  UBool UVar2;
  uint16_t *group;
  uint end;
  uint uVar3;
  uint start_00;
  int iVar4;
  uint uVar5;
  ushort *puVar6;
  ushort *puVar7;
  ushort local_40;
  
  group = getGroup(names,start);
  uVar5 = (uint)start >> 5 & 0xffff;
  start_00 = start;
  if (nameChoice == U_EXTENDED_CHAR_NAME && uVar5 < *group) {
    start_00 = (uint)*group * 0x20;
    if (limit <= (int)start_00) {
      start_00 = limit;
    }
    UVar2 = enumExtNames(start,start_00 - 1,fn,context);
    if (UVar2 == '\0') {
      return '\0';
    }
  }
  end = limit - 1;
  uVar3 = end >> 5 & 0xffff;
  if (uVar5 == uVar3) {
    if (*group == (uint16_t)((uint)start >> 5)) {
LAB_001baefb:
      UVar2 = enumGroupNames(names,group,start_00,end,fn,context,nameChoice);
      return UVar2;
    }
    if (nameChoice != U_EXTENDED_CHAR_NAME) {
      return '\x01';
    }
  }
  else {
    puVar6 = (ushort *)
             ((long)&names->tokenStringOffset +
             (ulong)*(ushort *)((long)&names->tokenStringOffset + (ulong)names->groupsOffset) * 6 +
             (ulong)names->groupsOffset + 2);
    puVar7 = group;
    if (uVar5 == *group) {
      if ((start_00 & 0x1f) != 0) {
        UVar2 = enumGroupNames(names,group,start_00,uVar5 << 5 | 0x1f,fn,context,nameChoice);
        if (UVar2 == '\0') {
          return '\0';
        }
        puVar7 = group + 3;
      }
    }
    else if (((*group < uVar5) && (puVar7 = group + 3, puVar7 < puVar6)) &&
            (uVar5 < *puVar7 && nameChoice == U_EXTENDED_CHAR_NAME)) {
      iVar4 = (uint)*puVar7 << 5;
      if (limit <= iVar4) {
        iVar4 = limit;
      }
      UVar2 = enumExtNames(start_00,iVar4 + -1,fn,context);
      if (UVar2 == '\0') {
        return '\0';
      }
    }
    while (group = puVar7, group < puVar6) {
      uVar1 = *group;
      if (uVar3 <= uVar1) {
        local_40 = (ushort)(end >> 5);
        if (uVar1 != local_40) break;
        start_00 = end & 0xffffffe0;
        goto LAB_001baefb;
      }
      start_00 = (uint)uVar1 * 0x20;
      UVar2 = enumGroupNames(names,group,start_00,start_00 + 0x1f,fn,context,nameChoice);
      if (UVar2 == '\0') {
        return '\0';
      }
      puVar7 = group + 3;
      if ((puVar7 < puVar6) && (nameChoice == U_EXTENDED_CHAR_NAME)) {
        if (*group + 1 < (uint)group[3]) {
          iVar4 = (uint)group[3] << 5;
          if (limit <= iVar4) {
            iVar4 = limit;
          }
          UVar2 = enumExtNames((uint)*group * 0x20 + 0x20,iVar4 + -1,fn,context);
          if (UVar2 == '\0') {
            return '\0';
          }
        }
      }
    }
    if (nameChoice != U_EXTENDED_CHAR_NAME) {
      return '\x01';
    }
    if (group != puVar6) {
      return '\x01';
    }
    uVar5 = (uint)group[-3] * 0x20 + 0x20;
    if ((int)start_00 < (int)uVar5) {
      start_00 = uVar5;
    }
  }
  iVar4 = 0x110000;
  if (limit < 0x110000) {
    iVar4 = limit;
  }
  UVar2 = enumExtNames(start_00,iVar4 + -1,fn,context);
  return UVar2;
}

Assistant:

static UBool
enumNames(UCharNames *names,
          UChar32 start, UChar32 limit,
          UEnumCharNamesFn *fn, void *context,
          UCharNameChoice nameChoice) {
    uint16_t startGroupMSB, endGroupMSB, groupCount;
    const uint16_t *group, *groupLimit;

    startGroupMSB=(uint16_t)(start>>GROUP_SHIFT);
    endGroupMSB=(uint16_t)((limit-1)>>GROUP_SHIFT);

    /* find the group that contains start, or the highest before it */
    group=getGroup(names, start);

    if(startGroupMSB<group[GROUP_MSB] && nameChoice==U_EXTENDED_CHAR_NAME) {
        /* enumerate synthetic names between start and the group start */
        UChar32 extLimit=((UChar32)group[GROUP_MSB]<<GROUP_SHIFT);
        if(extLimit>limit) {
            extLimit=limit;
        }
        if(!enumExtNames(start, extLimit-1, fn, context)) {
            return FALSE;
        }
        start=extLimit;
    }

    if(startGroupMSB==endGroupMSB) {
        if(startGroupMSB==group[GROUP_MSB]) {
            /* if start and limit-1 are in the same group, then enumerate only in that one */
            return enumGroupNames(names, group, start, limit-1, fn, context, nameChoice);
        }
    } else {
        const uint16_t *groups=GET_GROUPS(names);
        groupCount=*groups++;
        groupLimit=groups+groupCount*GROUP_LENGTH;

        if(startGroupMSB==group[GROUP_MSB]) {
            /* enumerate characters in the partial start group */
            if((start&GROUP_MASK)!=0) {
                if(!enumGroupNames(names, group,
                                   start, ((UChar32)startGroupMSB<<GROUP_SHIFT)+LINES_PER_GROUP-1,
                                   fn, context, nameChoice)) {
                    return FALSE;
                }
                group=NEXT_GROUP(group); /* continue with the next group */
            }
        } else if(startGroupMSB>group[GROUP_MSB]) {
            /* make sure that we start enumerating with the first group after start */
            const uint16_t *nextGroup=NEXT_GROUP(group);
            if (nextGroup < groupLimit && nextGroup[GROUP_MSB] > startGroupMSB && nameChoice == U_EXTENDED_CHAR_NAME) {
                UChar32 end = nextGroup[GROUP_MSB] << GROUP_SHIFT;
                if (end > limit) {
                    end = limit;
                }
                if (!enumExtNames(start, end - 1, fn, context)) {
                    return FALSE;
                }
            }
            group=nextGroup;
        }

        /* enumerate entire groups between the start- and end-groups */
        while(group<groupLimit && group[GROUP_MSB]<endGroupMSB) {
            const uint16_t *nextGroup;
            start=(UChar32)group[GROUP_MSB]<<GROUP_SHIFT;
            if(!enumGroupNames(names, group, start, start+LINES_PER_GROUP-1, fn, context, nameChoice)) {
                return FALSE;
            }
            nextGroup=NEXT_GROUP(group);
            if (nextGroup < groupLimit && nextGroup[GROUP_MSB] > group[GROUP_MSB] + 1 && nameChoice == U_EXTENDED_CHAR_NAME) {
                UChar32 end = nextGroup[GROUP_MSB] << GROUP_SHIFT;
                if (end > limit) {
                    end = limit;
                }
                if (!enumExtNames((group[GROUP_MSB] + 1) << GROUP_SHIFT, end - 1, fn, context)) {
                    return FALSE;
                }
            }
            group=nextGroup;
        }

        /* enumerate within the end group (group[GROUP_MSB]==endGroupMSB) */
        if(group<groupLimit && group[GROUP_MSB]==endGroupMSB) {
            return enumGroupNames(names, group, (limit-1)&~GROUP_MASK, limit-1, fn, context, nameChoice);
        } else if (nameChoice == U_EXTENDED_CHAR_NAME && group == groupLimit) {
            UChar32 next = (PREV_GROUP(group)[GROUP_MSB] + 1) << GROUP_SHIFT;
            if (next > start) {
                start = next;
            }
        } else {
            return TRUE;
        }
    }

    /* we have not found a group, which means everything is made of
       extended names. */
    if (nameChoice == U_EXTENDED_CHAR_NAME) {
        if (limit > UCHAR_MAX_VALUE + 1) {
            limit = UCHAR_MAX_VALUE + 1;
        }
        return enumExtNames(start, limit - 1, fn, context);
    }
    
    return TRUE;
}